

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O1

void percolate_down(roaring_pq_t *pq,uint32_t i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  roaring_pq_element_t *prVar4;
  roaring_bitmap_t *prVar5;
  _Bool _Var6;
  undefined7 uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 local_38;
  roaring_bitmap_t *prStack_30;
  
  uVar2 = (uint)pq->size;
  uVar3 = pq->elements[i].size;
  prVar4 = pq->elements + i;
  _Var6 = prVar4->is_temporary;
  uVar7 = *(undefined7 *)&prVar4->field_0x9;
  prVar5 = *(roaring_bitmap_t **)(&prVar4->is_temporary + 8);
  do {
    if (uVar2 >> 1 <= i) {
      uVar8 = (ulong)i;
      break;
    }
    uVar8 = (ulong)(i * 2 + 1);
    uVar1 = i * 2 + 2;
    prVar4 = pq->elements;
    uVar9 = prVar4[uVar8].size;
    local_38 = *(undefined8 *)&prVar4[uVar8].is_temporary;
    prStack_30 = *(roaring_bitmap_t **)(&prVar4[uVar8].is_temporary + 8);
    if (uVar1 < uVar2) {
      if (prVar4[uVar1].size < uVar9) {
        local_38 = *(undefined8 *)&prVar4[uVar1].is_temporary;
        prStack_30 = prVar4[uVar1].bitmap;
        uVar8 = (ulong)uVar1;
        uVar9 = prVar4[uVar1].size;
      }
    }
    if (uVar9 < uVar3) {
      prVar4[i].size = uVar9;
      *(undefined8 *)&prVar4[i].is_temporary = local_38;
      *(roaring_bitmap_t **)(&prVar4[i].is_temporary + 8) = prStack_30;
    }
    else {
      uVar8 = (ulong)i;
    }
    i = (uint32_t)uVar8;
  } while (uVar9 < uVar3);
  prVar4 = pq->elements;
  prVar4[uVar8].size = uVar3;
  prVar4 = prVar4 + uVar8;
  prVar4->is_temporary = _Var6;
  *(undefined7 *)&prVar4->field_0x9 = uVar7;
  *(roaring_bitmap_t **)(&prVar4->is_temporary + 8) = prVar5;
  return;
}

Assistant:

static void percolate_down(roaring_pq_t *pq, uint32_t i) {
    uint32_t size = (uint32_t)pq->size;
    uint32_t hsize = size >> 1;
    roaring_pq_element_t ai = pq->elements[i];
    while (i < hsize) {
        uint32_t l = (i << 1) + 1;
        uint32_t r = l + 1;
        roaring_pq_element_t bestc = pq->elements[l];
        if (r < size) {
            if (compare(pq->elements + r, &bestc)) {
                l = r;
                bestc = pq->elements[r];
            }
        }
        if (!compare(&bestc, &ai)) {
            break;
        }
        pq->elements[i] = bestc;
        i = l;
    }
    pq->elements[i] = ai;
}